

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

bool __thiscall QJsonPrivate::Parser::parseObject(Parser *this)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ValueFlags VVar6;
  int iVar7;
  byte *pbVar8;
  QCborContainerPrivate *pQVar9;
  iterator iVar10;
  iterator iVar11;
  long lVar12;
  long *plVar13;
  char *pcVar14;
  long *plVar15;
  byte bVar16;
  byte *pbVar17;
  Element *pEVar18;
  Element *pEVar19;
  QList<QtCbor::Element> *this_00;
  Element *pEVar20;
  Element *pEVar21;
  long in_FS_OFFSET;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Type TVar25;
  Int IVar26;
  QBasicUtf8StringView<false> rhs;
  QStringView utf16;
  QStringView utf16_00;
  QStringView rhs_00;
  QBasicUtf8StringView<false> rhs_01;
  QStringView utf16_01;
  QStringView utf16_02;
  QStringView rhs_02;
  QBasicUtf8StringView<false> lhs;
  QByteArrayView utf8;
  QByteArrayView utf8_00;
  QStringView lhs_00;
  QBasicUtf8StringView<false> lhs_01;
  QByteArrayView utf8_01;
  QByteArrayView utf8_02;
  QStringView lhs_02;
  QCborContainerPrivate *local_60;
  _Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = this->nestingLevel;
  this->nestingLevel = iVar7 + 1;
  if (iVar7 < 0x400) {
    pbVar8 = (byte *)this->json;
    pbVar1 = (byte *)this->end;
    if (pbVar8 < pbVar1) {
      bVar16 = *pbVar8;
      if ((char)bVar16 < '!') {
        bVar22 = true;
        while ((pbVar17 = pbVar8 + 1, bVar16 < 0x21 &&
               ((0x100002600U >> ((ulong)bVar16 & 0x3f) & 1) != 0))) {
          this->json = (char *)pbVar17;
          bVar22 = pbVar17 < pbVar1;
          pbVar8 = pbVar17;
          if ((pbVar17 == pbVar1) || (bVar16 = *pbVar17, ' ' < (char)bVar16)) break;
        }
        if (!bVar22) goto LAB_001507de;
      }
      this->json = (char *)(pbVar8 + 1);
      bVar16 = *pbVar8;
      if ((((0x3b < bVar16 - 0x22) ||
           ((0xa00000001000401U >> ((ulong)(bVar16 - 0x22) & 0x3f) & 1) == 0)) && (bVar16 != 0x7b))
         && (bVar16 != 0x7d)) goto LAB_001507de;
    }
    else {
LAB_001507de:
      bVar16 = 0;
    }
    do {
      if (bVar16 != 0x22) {
LAB_00150947:
        if (bVar16 != 0x7d) {
LAB_00150a0b:
          this->lastError = UnterminatedObject;
          goto LAB_00150a12;
        }
        this->nestingLevel = this->nestingLevel + -1;
        pQVar9 = (this->container).d.ptr;
        bVar22 = true;
        if (pQVar9 == (QCborContainerPrivate *)0x0) goto LAB_00150a14;
        this_00 = &pQVar9->elements;
        local_60 = pQVar9;
        iVar10 = QList<QtCbor::Element>::begin(this_00);
        iVar11 = QList<QtCbor::Element>::end(this_00);
        if (iVar10.i != iVar11.i) {
          lVar12 = ((long)iVar11.i - (long)iVar10.i >> 4) -
                   ((long)iVar11.i - (long)iVar10.i >> 0x3f) >> 1;
          local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
          local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
          local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
          std::
          _Temporary_buffer<QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>,_QJsonPrivate::ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>::value_type>
          ::_Temporary_buffer(&local_58,
                              (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)
                              iVar10.i,(lVar12 - (lVar12 + 1 >> 0x3f)) + 1 >> 1);
          if (local_58._M_buffer == (value_type *)0x0) {
            std::
            __inplace_stable_sort<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar10.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar11.i,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_60);
          }
          else {
            std::
            __stable_sort_adaptive<QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>,QJsonPrivate::ObjectIterator<QtCbor::Element,QList<QtCbor::Element>::iterator>::value_type*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<sortContainer(QCborContainerPrivate*)::__0>>
                      ((ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar10.i,
                       (ObjectIterator<QtCbor::Element,_QList<QtCbor::Element>::iterator>)iVar11.i,
                       local_58._M_buffer,local_58._M_len,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_serialization_qjsonparser_cpp:418:17)>
                        )&local_60);
          }
          operator_delete(local_58._M_buffer,local_58._M_len << 5);
        }
        iVar10 = QList<QtCbor::Element>::begin(this_00);
        iVar11 = QList<QtCbor::Element>::end(this_00);
        pEVar18 = iVar10.i + 2;
        if (pEVar18 != iVar11.i && iVar10.i != iVar11.i) goto LAB_00150aa9;
        goto LAB_00150d52;
      }
      if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
        pQVar9 = (QCborContainerPrivate *)operator_new(0x40);
        (pQVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        pQVar9->usedData = 0;
        (pQVar9->data).d.d = (Data *)0x0;
        (pQVar9->data).d.ptr = (char *)0x0;
        (pQVar9->data).d.size = 0;
        (pQVar9->elements).d.d = (Data *)0x0;
        (pQVar9->elements).d.ptr = (Element *)0x0;
        (pQVar9->elements).d.size = 0;
        QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,pQVar9);
      }
      bVar22 = parseMember(this);
      if (!bVar22) goto LAB_00150a12;
      pbVar8 = (byte *)this->json;
      pbVar1 = (byte *)this->end;
      if (pbVar1 <= pbVar8) goto LAB_00150a0b;
      bVar16 = *pbVar8;
      if ((char)bVar16 < '!') {
        bVar22 = true;
        while ((pbVar17 = pbVar8 + 1, bVar16 < 0x21 &&
               ((0x100002600U >> ((ulong)bVar16 & 0x3f) & 1) != 0))) {
          this->json = (char *)pbVar17;
          bVar22 = pbVar17 < pbVar1;
          pbVar8 = pbVar17;
          if ((pbVar17 == pbVar1) || (bVar16 = *pbVar17, ' ' < (char)bVar16)) break;
        }
        if (!bVar22) goto LAB_00150a0b;
      }
      pbVar17 = pbVar8 + 1;
      this->json = (char *)pbVar17;
      bVar16 = *pbVar8;
      if (bVar16 != 0x2c) {
        if (((bVar16 - 0x22 < 0x3c) &&
            ((0xa00000001000001U >> ((ulong)(bVar16 - 0x22) & 0x3f) & 1) != 0)) ||
           ((bVar16 == 0x7b || (bVar16 == 0x7d)))) goto LAB_00150947;
        goto LAB_00150a0b;
      }
      if (pbVar17 < pbVar1) {
        bVar16 = *pbVar17;
        if ((char)bVar16 < '!') {
          bVar22 = true;
          pbVar8 = pbVar8 + 2;
          do {
            pbVar17 = pbVar8;
            if ((0x20 < bVar16) || ((0x100002600U >> ((ulong)bVar16 & 0x3f) & 1) == 0)) {
              pbVar17 = pbVar17 + -1;
              break;
            }
            this->json = (char *)pbVar17;
            bVar22 = pbVar17 < pbVar1;
            if (pbVar17 == pbVar1) break;
            bVar16 = *pbVar17;
            pbVar8 = pbVar17 + 1;
          } while ((char)bVar16 < '!');
          if (!bVar22) goto LAB_00150911;
        }
        this->json = (char *)(pbVar17 + 1);
        bVar16 = *pbVar17;
        if ((((0x3b < bVar16 - 0x22) ||
             ((0xa00000001000401U >> ((ulong)(bVar16 - 0x22) & 0x3f) & 1) == 0)) && (bVar16 != 0x7b)
            ) && (bVar16 != 0x7d)) goto LAB_00150911;
      }
      else {
LAB_00150911:
        bVar16 = 0;
      }
    } while (bVar16 != 0x7d);
    this->lastError = MissingObject;
  }
  else {
    this->lastError = DeepNesting;
  }
LAB_00150a12:
  bVar22 = false;
LAB_00150a14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar22;
LAB_00150aa9:
  do {
    pcVar14 = (local_60->data).d.ptr;
    if (pcVar14 == (char *)0x0) {
      pcVar14 = "";
    }
    uVar2._0_4_ = pEVar18[-2].type;
    uVar2._4_4_ = pEVar18[-2].flags;
    uVar3._0_4_ = pEVar18->type;
    uVar3._4_4_ = pEVar18->flags;
    if ((uVar2 & 0x200000000) == 0) {
      iVar7 = -(uint)((uVar3 & 0x200000000) != 0);
LAB_00150ad6:
      if (iVar7 == 0) {
        pEVar21 = pEVar18 + -2;
        if (pEVar21 != iVar11.i) {
          pEVar20 = pEVar18 + -1;
          if ((pEVar18[-1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
            QCborContainerPrivate::deref((pEVar20->field_0).container);
          }
          TVar25 = pEVar18->type;
          VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
               (pEVar18->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
          pEVar21->field_0 = pEVar18->field_0;
          pEVar18[-2].type = TVar25;
          pEVar18[-2].flags =
               (ValueFlags)
               VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
          uVar23 = *(undefined4 *)&pEVar18[1].field_0;
          uVar24 = *(undefined4 *)((long)&pEVar18[1].field_0 + 4);
          TVar25 = pEVar18[1].type;
          IVar26 = pEVar18[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                   super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
          do {
            *(undefined4 *)&pEVar20->field_0 = uVar23;
            *(undefined4 *)((long)&pEVar20->field_0 + 4) = uVar24;
            pEVar20->type = TVar25;
            (pEVar20->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
            super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = IVar26;
            do {
              pEVar19 = pEVar18;
              pEVar19[1].field_0.value = 0;
              pEVar19[1].type = Undefined;
              pEVar19[1].flags = (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)0x0;
              pEVar18 = pEVar19 + 2;
              if (pEVar18 == iVar11.i) {
                iVar11.i = pEVar21 + 2;
                goto LAB_00150d52;
              }
              pcVar14 = (local_60->data).d.ptr;
              if (pcVar14 == (char *)0x0) {
                pcVar14 = "";
              }
              uVar4._0_4_ = pEVar21->type;
              uVar4._4_4_ = pEVar21->flags;
              uVar5._0_4_ = pEVar19[2].type;
              uVar5._4_4_ = pEVar19[2].flags;
              if ((uVar4 & 0x200000000) == 0) {
                iVar7 = -(uint)((uVar5 & 0x200000000) != 0);
LAB_00150c44:
                if (iVar7 != 0) goto LAB_00150c81;
              }
              else {
                if ((uVar5 & 0x200000000) != 0) {
                  plVar13 = (long *)(pcVar14 + (pEVar21->field_0).value);
                  plVar15 = (long *)(pcVar14 + (pEVar18->field_0).value);
                  if ((uVar4 & 0x400000000) == 0) {
                    if ((uVar5 & 0x400000000) == 0) {
                      rhs_01.m_data = plVar15 + 1;
                      rhs_01.m_size = *plVar15;
                      lhs_01.m_size = *plVar13;
                      lhs_01.m_data = (storage_type *)(plVar13 + 1);
                      iVar7 = QtPrivate::compareStrings(lhs_01,rhs_01,CaseSensitive);
                    }
                    else {
                      utf16_02.m_data = (storage_type_conflict *)(plVar15 + 1);
                      utf16_02.m_size = *plVar15 / 2;
                      utf8_02.m_data = (storage_type *)(plVar13 + 1);
                      utf8_02.m_size = *plVar13;
                      iVar7 = QUtf8::compareUtf8(utf8_02,utf16_02,CaseSensitive);
                    }
                  }
                  else {
                    utf16_01.m_size = *plVar13 / 2;
                    if ((uVar5 & 0x400000000) == 0) {
                      utf16_01.m_data = (storage_type_conflict *)(plVar13 + 1);
                      utf8_01.m_data = (storage_type *)(plVar15 + 1);
                      utf8_01.m_size = *plVar15;
                      iVar7 = QUtf8::compareUtf8(utf8_01,utf16_01,CaseSensitive);
                      iVar7 = -iVar7;
                    }
                    else {
                      rhs_02.m_size = *plVar15 / 2;
                      rhs_02.m_data = (storage_type_conflict *)(plVar15 + 1);
                      lhs_02.m_size = utf16_01.m_size;
                      lhs_02.m_data = (storage_type_conflict *)(plVar13 + 1);
                      iVar7 = QtPrivate::compareStrings(lhs_02,rhs_02,CaseSensitive);
                    }
                  }
                  goto LAB_00150c44;
                }
LAB_00150c81:
                pEVar21 = pEVar21 + 2;
              }
              pEVar20 = pEVar21 + 1;
              if ((pEVar21[1].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                   super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
                QCborContainerPrivate::deref((pEVar20->field_0).container);
              }
            } while (pEVar18 == pEVar21);
            TVar25 = pEVar19[2].type;
            VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
            super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
                 pEVar19[2].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
            pEVar21->field_0 = pEVar18->field_0;
            pEVar21->type = TVar25;
            pEVar21->flags =
                 (ValueFlags)
                 VVar6.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                 super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
            uVar23 = *(undefined4 *)&pEVar19[3].field_0;
            uVar24 = *(undefined4 *)((long)&pEVar19[3].field_0 + 4);
            TVar25 = pEVar19[3].type;
            IVar26 = pEVar19[3].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                     super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
          } while( true );
        }
        break;
      }
    }
    else if ((uVar3 & 0x200000000) != 0) {
      plVar13 = (long *)(pcVar14 + pEVar18[-2].field_0.value);
      plVar15 = (long *)(pcVar14 + (pEVar18->field_0).value);
      if ((uVar2 & 0x400000000) == 0) {
        if ((uVar3 & 0x400000000) == 0) {
          rhs.m_data = plVar15 + 1;
          rhs.m_size = *plVar15;
          lhs.m_size = *plVar13;
          lhs.m_data = (storage_type *)(plVar13 + 1);
          iVar7 = QtPrivate::compareStrings(lhs,rhs,CaseSensitive);
        }
        else {
          utf16_00.m_data = (storage_type_conflict *)(plVar15 + 1);
          utf16_00.m_size = *plVar15 / 2;
          utf8_00.m_data = (storage_type *)(plVar13 + 1);
          utf8_00.m_size = *plVar13;
          iVar7 = QUtf8::compareUtf8(utf8_00,utf16_00,CaseSensitive);
        }
      }
      else {
        utf16.m_size = *plVar13 / 2;
        if ((uVar3 & 0x400000000) == 0) {
          utf16.m_data = (storage_type_conflict *)(plVar13 + 1);
          utf8.m_data = (storage_type *)(plVar15 + 1);
          utf8.m_size = *plVar15;
          iVar7 = QUtf8::compareUtf8(utf8,utf16,CaseSensitive);
          iVar7 = -iVar7;
        }
        else {
          rhs_00.m_size = *plVar15 / 2;
          rhs_00.m_data = (storage_type_conflict *)(plVar15 + 1);
          lhs_00.m_size = utf16.m_size;
          lhs_00.m_data = (storage_type_conflict *)(plVar13 + 1);
          iVar7 = QtPrivate::compareStrings(lhs_00,rhs_00,CaseSensitive);
        }
      }
      goto LAB_00150ad6;
    }
    pEVar18 = pEVar18 + 2;
  } while (pEVar18 != iVar11.i);
LAB_00150d52:
  iVar10 = QList<QtCbor::Element>::end(this_00);
  QList<QtCbor::Element>::erase(this_00,(const_iterator)iVar11.i,(const_iterator)iVar10.i);
  goto LAB_00150a14;
}

Assistant:

bool Parser::parseObject()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    char token = nextToken();
    while (token == Quote) {
        if (!container)
            container = new QCborContainerPrivate;
        if (!parseMember())
            return false;
        token = nextToken();
        if (token != ValueSeparator)
            break;
        token = nextToken();
        if (token == EndObject) {
            lastError = QJsonParseError::MissingObject;
            return false;
        }
    }

    if (token != EndObject) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    --nestingLevel;

    if (container)
        sortContainer(container.data());
    return true;
}